

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::Flower::filterPackedDataReads
          (Flower *this,PossibleContents *contents,ExpressionLocation *exprLoc)

{
  byte bVar1;
  Expression *this_00;
  bool bVar2;
  uint uVar3;
  StructGet *pSVar4;
  HeapType type;
  Field *pFVar5;
  Type type_00;
  PossibleContents local_138;
  Literal local_118;
  PossibleContents local_100;
  Literal local_e0;
  Literal local_c8;
  undefined1 local_a0 [8];
  Literal lit;
  Literal shifts;
  undefined1 local_68 [8];
  optional<wasm::Field> field;
  ArrayGet *get_1;
  StructGet *get;
  Expression *pEStack_38;
  Index index;
  Expression *ref;
  bool signed_;
  Expression *expr;
  ExpressionLocation *exprLoc_local;
  PossibleContents *contents_local;
  Flower *this_local;
  
  this_00 = exprLoc->expr;
  pSVar4 = Expression::dynCast<wasm::StructGet>(this_00);
  if (pSVar4 == (StructGet *)0x0) {
    field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Field>._16_8_ = Expression::dynCast<wasm::ArrayGet>(this_00);
    if ((ArrayGet *)
        field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Field>._16_8_ == (ArrayGet *)0x0) {
      handle_unreachable("bad packed read",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                         ,0xb1f);
    }
    bVar1 = ((ArrayGet *)
            field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Field>._16_8_)->signed_;
    pEStack_38 = ((ArrayGet *)
                 field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Field>._16_8_)->ref;
    get._4_4_ = 0;
  }
  else {
    bVar1 = pSVar4->signed_;
    pEStack_38 = pSVar4->ref;
    get._4_4_ = pSVar4->index;
  }
  ref._7_1_ = bVar1 & 1;
  if (ref._7_1_ != 0) {
    bVar2 = wasm::Type::isRef(&pEStack_38->type);
    if (!bVar2) {
      __assert_fail("ref->type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                    ,0xb27,
                    "void wasm::(anonymous namespace)::Flower::filterPackedDataReads(PossibleContents &, const ExpressionLocation &)"
                   );
    }
    type = wasm::Type::getHeapType(&pEStack_38->type);
    GCTypeUtils::getField((optional<wasm::Field> *)local_68,type,get._4_4_);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_68);
    if (!bVar2) {
      __assert_fail("field",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/possible-contents.cpp"
                    ,0xb29,
                    "void wasm::(anonymous namespace)::Flower::filterPackedDataReads(PossibleContents &, const ExpressionLocation &)"
                   );
    }
    pFVar5 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_68);
    bVar2 = Field::isPacked(pFVar5);
    if (bVar2) {
      bVar2 = PossibleContents::isLiteral(contents);
      if (bVar2) {
        pFVar5 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_68);
        uVar3 = Field::getByteSize(pFVar5);
        wasm::Literal::Literal((Literal *)&lit.type,uVar3 * -8 + 0x20);
        PossibleContents::getLiteral((Literal *)local_a0,contents);
        wasm::Literal::shl(&local_c8,(Literal *)local_a0,(Literal *)&lit.type);
        wasm::Literal::operator=((Literal *)local_a0,&local_c8);
        wasm::Literal::~Literal(&local_c8);
        wasm::Literal::shrS(&local_e0,(Literal *)local_a0,(Literal *)&lit.type);
        wasm::Literal::operator=((Literal *)local_a0,&local_e0);
        wasm::Literal::~Literal(&local_e0);
        wasm::Literal::Literal(&local_118,(Literal *)local_a0);
        PossibleContents::literal(&local_100,&local_118);
        PossibleContents::operator=(contents,&local_100);
        PossibleContents::~PossibleContents(&local_100);
        wasm::Literal::~Literal(&local_118);
        wasm::Literal::~Literal((Literal *)local_a0);
        wasm::Literal::~Literal((Literal *)&lit.type);
      }
      else {
        type_00 = PossibleContents::getType(contents);
        PossibleContents::fromType(&local_138,type_00);
        PossibleContents::operator=(contents,&local_138);
        PossibleContents::~PossibleContents(&local_138);
      }
    }
  }
  return;
}

Assistant:

void Flower::filterPackedDataReads(PossibleContents& contents,
                                   const ExpressionLocation& exprLoc) {
  auto* expr = exprLoc.expr;

  // Packed fields are stored as the truncated bits (see comment on
  // DataLocation; the actual truncation is done in filterDataContents), which
  // means that unsigned gets just work but signed ones need fixing (and we only
  // know how to do that here, when we reach the get and see if it is signed).
  auto signed_ = false;
  Expression* ref;
  Index index;
  if (auto* get = expr->dynCast<StructGet>()) {
    signed_ = get->signed_;
    ref = get->ref;
    index = get->index;
  } else if (auto* get = expr->dynCast<ArrayGet>()) {
    signed_ = get->signed_;
    ref = get->ref;
    // Arrays are treated as having a single field.
    index = 0;
  } else {
    WASM_UNREACHABLE("bad packed read");
  }
  if (!signed_) {
    return;
  }

  // We are reading data here, so the reference must be a valid struct or
  // array, otherwise we would never have gotten here.
  assert(ref->type.isRef());
  auto field = GCTypeUtils::getField(ref->type.getHeapType(), index);
  assert(field);
  if (!field->isPacked()) {
    return;
  }

  if (contents.isLiteral()) {
    // This is a constant. We can sign-extend it and use that value.
    auto shifts = Literal(int32_t(32 - field->getByteSize() * 8));
    auto lit = contents.getLiteral();
    lit = lit.shl(shifts);
    lit = lit.shrS(shifts);
    contents = PossibleContents::literal(lit);
  } else {
    // This is not a constant. As in filterDataContents, give up and leave
    // only the type, since we have no way to track the sign-extension on
    // top of whatever this is.
    contents = PossibleContents::fromType(contents.getType());
  }
}